

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O0

size_t __thiscall
xray_re::xr_reader::find_chunk(xr_reader *this,uint32_t find_id,bool *compressed,bool reset)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t size;
  uint32_t id;
  bool reset_local;
  bool *compressed_local;
  uint32_t find_id_local;
  xr_reader *this_local;
  
  if (reset) {
    this->field_2 = (anon_union_8_7_9f64dffd_for_xr_reader_2)this->m_data;
  }
  while( true ) {
    if (this->m_end <= (this->field_2).m_p) {
      return 0;
    }
    if (this->m_end < (this->field_2).m_p + 8) {
      __assert_fail("m_p + 8 <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x1a,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
    }
    uVar1 = r_u32(this);
    uVar2 = r_u32(this);
    uVar3 = (ulong)uVar2;
    if (this->m_end < (this->field_2).m_p + uVar3) {
      __assert_fail("m_p + size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x1d,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
    }
    if (find_id == (uVar1 & 0x7fffffff)) break;
    (this->field_2).m_p = (this->field_2).m_p + uVar3;
  }
  if (compressed == (bool *)0x0 && (uVar1 & 0x80000000) != 0) {
    __assert_fail("compressed || (id & CHUNK_COMPRESSED) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x1f,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
  }
  if (compressed == (bool *)0x0) {
    return uVar3;
  }
  *compressed = (uVar1 & 0x80000000) != 0;
  return uVar3;
}

Assistant:

size_t xr_reader::find_chunk(uint32_t find_id, bool* compressed, bool reset)
{
	if (reset)
		m_p = m_data;
	while (m_p < m_end) {
		assert(m_p + 8 <= m_end);
		uint32_t id = r_u32();
		size_t size = r_u32();
		assert(m_p + size <= m_end);
		if (find_id == (id & CHUNK_ID_MASK)) {
			xr_assert(compressed || (id & CHUNK_COMPRESSED) == 0);
			if (compressed != 0)
				*compressed = (id & CHUNK_COMPRESSED) != 0;
//			m_debug_find_chunk = m_p + size;
			return size;
		}
		m_p += size;
	}
	return 0;
}